

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslconfiguration.cpp
# Opt level: O0

void __thiscall QSslConfiguration::setPeerVerifyMode(QSslConfiguration *this,PeerVerifyMode mode)

{
  QSslConfigurationPrivate *pQVar1;
  PeerVerifyMode in_ESI;
  
  pQVar1 = QSharedDataPointer<QSslConfigurationPrivate>::operator->
                     ((QSharedDataPointer<QSslConfigurationPrivate> *)CONCAT44(in_ESI,in_ESI));
  pQVar1->peerVerifyMode = in_ESI;
  return;
}

Assistant:

void QSslConfiguration::setPeerVerifyMode(QSslSocket::PeerVerifyMode mode)
{
    d->peerVerifyMode = mode;
}